

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase363::run(TestCase363 *this)

{
  WaitScope waitScope;
  PromiseFulfillerPair<int> pair;
  EventLoop loop;
  Runnable local_188;
  PromiseFulfillerPair<int> *local_180;
  WaitScope *local_178;
  NullableValue<kj::Exception> local_170;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  newPromiseAndFulfiller<int>();
  Own<kj::PromiseFulfiller<int>_>::dispose(&pair.fulfiller);
  local_188._vptr_Runnable = (_func_int **)&PTR_run_0041acd8;
  local_178 = &waitScope;
  local_180 = &pair;
  _::runCatchingExceptions((Maybe<kj::Exception> *)&local_170,&local_188);
  _::NullableValue<kj::Exception>::~NullableValue(&local_170);
  if ((local_170.isSet == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[97]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x172,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { pair.promise.wait(waitScope); }) != nullptr\""
               ,(char (*) [97])
                "failed: expected ::kj::runCatchingExceptions([&]() { pair.promise.wait(waitScope); }) != nullptr"
              );
  }
  PromiseFulfillerPair<int>::~PromiseFulfillerPair(&pair);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerDiscarded) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<int>();
  pair.fulfiller = nullptr;

  EXPECT_ANY_THROW(pair.promise.wait(waitScope));
}